

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O3

Argument * dg::vr::getArgument(ValueRelations *graph,Handle h)

{
  _Rb_tree_header *p_Var1;
  Argument *pAVar2;
  _Base_ptr p_Var3;
  HandlePtr mH;
  Argument *pAVar4;
  _Base_bitset<1UL> local_58;
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  local_50;
  
  local_58._M_w = 0x44;
  pAVar4 = (Argument *)0x0;
  RelationsGraph<dg::vr::ValueRelations>::getRelated
            ((RelationsMap *)&local_50,&graph->graph,h,(Relations *)&local_58,false);
  p_Var1 = &local_50._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_50._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    pAVar4 = (Argument *)0x0;
    p_Var3 = local_50._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pAVar2 = ValueRelations::getInstance<llvm::Argument>(graph,*(Handle *)(p_Var3 + 1));
      if (pAVar2 != (Argument *)0x0) {
        pAVar4 = pAVar2;
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  std::
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::_M_erase(&local_50,(_Link_type)local_50._M_impl.super__Rb_tree_header._M_header._M_parent);
  return pAVar4;
}

Assistant:

const llvm::Argument *getArgument(const ValueRelations &graph,
                                  ValueRelations::Handle h) {
    const llvm::Argument *result = nullptr;
    for (auto handleRel : graph.getRelated(h, Relations().sle().sge())) {
        const llvm::Argument *arg =
                graph.getInstance<llvm::Argument>(handleRel.first);
        if (arg) {
            assert(!result);
            result = arg;
        }
    }
    return result;
}